

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O1

DeepFrameBuffer * __thiscall
Imf_3_4::DeepScanLineOutputFile::frameBuffer(DeepScanLineOutputFile *this)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  int iVar2;
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  iVar2 = pthread_mutex_lock(__mutex);
  if (iVar2 == 0) {
    pDVar1 = this->_data;
    pthread_mutex_unlock(__mutex);
    return &pDVar1->frameBuffer;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

const DeepFrameBuffer&
DeepScanLineOutputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    return _data->frameBuffer;
}